

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O1

void __thiscall FPathTraverse::AddLineIntercepts(FPathTraverse *this,int bx,int by)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  intercept_t *piVar7;
  intercept_t *piVar8;
  uint uVar9;
  polyblock_t *ppVar10;
  line_t *plVar11;
  polyblock_t **pppVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double v1dx;
  double v1dy;
  FBlockLinesIterator local_50;
  
  if ((((by | bx) < 0) || (bmapwidth <= bx)) || (bmapheight <= by)) {
    pppVar12 = &local_50.polyLink;
    local_50.list = (int *)0x0;
    ppVar10 = (polyblock_t *)0x0;
  }
  else {
    uVar9 = bmapwidth * by + bx;
    if (PolyBlockMap == (polyblock_t **)0x0) {
      local_50.polyLink = (polyblock_t *)0x0;
    }
    else {
      local_50.polyLink = PolyBlockMap[uVar9];
    }
    pppVar12 = (polyblock_t **)&local_50.list;
    local_50.polyIndex = 0;
    ppVar10 = (polyblock_t *)(blockmaplump + (long)blockmap[uVar9] + 1);
  }
  *pppVar12 = ppVar10;
  local_50.minx = bx;
  local_50.maxx = bx;
  local_50.miny = by;
  local_50.maxy = by;
  local_50.curx = bx;
  local_50.cury = by;
  plVar11 = FBlockLinesIterator::Next(&local_50);
  if (plVar11 != (line_t *)0x0) {
    do {
      dVar1 = (plVar11->v1->p).X;
      dVar2 = (plVar11->v1->p).Y;
      dVar3 = (this->trace).x;
      dVar4 = (this->trace).y;
      dVar15 = (this->trace).dx;
      dVar14 = (this->trace).dy;
      if (1.52587890625e-05 < (dVar3 - dVar1) * dVar14 + (dVar2 - dVar4) * dVar15 ==
          (dVar3 - (plVar11->v2->p).X) * dVar14 + ((plVar11->v2->p).Y - dVar4) * dVar15 <=
          1.52587890625e-05) {
        dVar5 = (plVar11->delta).X;
        dVar6 = (plVar11->delta).Y;
        dVar14 = dVar15 * dVar6 - dVar14 * dVar5;
        dVar15 = 0.0;
        if ((dVar14 != 0.0) || (NAN(dVar14))) {
          dVar15 = ((dVar4 - dVar2) * dVar5 + (dVar1 - dVar3) * dVar6) / dVar14;
        }
        if ((dVar15 <= 1.0) && (this->Startfrac <= dVar15)) {
          TArray<intercept_t,_intercept_t>::Grow(&intercepts,1);
          piVar8 = intercepts.Array;
          uVar13 = (ulong)intercepts.Count;
          intercepts.Array[uVar13].frac = dVar15;
          piVar7 = piVar8 + uVar13;
          piVar7->isaline = true;
          piVar7->done = false;
          piVar8[uVar13].d.line = plVar11;
          intercepts.Count = intercepts.Count + 1;
        }
      }
      plVar11 = FBlockLinesIterator::Next(&local_50);
    } while (plVar11 != (line_t *)0x0);
  }
  return;
}

Assistant:

void FPathTraverse::AddLineIntercepts(int bx, int by)
{
	FBlockLinesIterator it(bx, by, bx, by, true);
	line_t *ld;

	while ((ld = it.Next()))
	{
		int 				s1;
		int 				s2;
		double 				frac;
		divline_t			dl;

		s1 = P_PointOnDivlineSide (ld->v1->fX(), ld->v1->fY(), &trace);
		s2 = P_PointOnDivlineSide (ld->v2->fX(), ld->v2->fY(), &trace);
		
		if (s1 == s2) continue;	// line isn't crossed
		
		// hit the line
		P_MakeDivline (ld, &dl);
		frac = P_InterceptVector (&trace, &dl);

		if (frac < Startfrac || frac > 1.) continue;	// behind source or beyond end point
			
		intercept_t newintercept;

		newintercept.frac = frac;
		newintercept.isaline = true;
		newintercept.done = false;
		newintercept.d.line = ld;
		intercepts.Push (newintercept);
	}
}